

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<kj::Own<kj::AsyncIoStream>_>
kj::anon_unknown_30::NetworkAddressImpl::connectImpl
          (LowLevelAsyncIoProvider *lowLevel,NetworkFilter *filter,
          ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs)

{
  _func_int ***ppp_Var1;
  _func_int ***ppp_Var2;
  undefined8 uVar3;
  Disposer *pDVar4;
  PromiseNode *pPVar5;
  TransformPromiseNodeBase *this;
  ChainPromiseNode *pCVar6;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  _func_int **in_R8;
  Own<kj::_::ImmediateBrokenPromiseNode> OVar7;
  Own<kj::_::ChainPromiseNode> OVar8;
  Promise<kj::Own<kj::AsyncIoStream>_> PVar9;
  Fault f;
  NullableValue<kj::Exception> e;
  Own<kj::_::PromiseNode> local_338;
  _func_int **local_328;
  _func_int **pp_Stack_320;
  Runnable local_318;
  Own<kj::_::PromiseNode> *pOStack_310;
  _func_int ****local_308;
  _func_int ***local_300;
  SocketAddress *local_2f8;
  NetworkFilter *local_2f0;
  Maybe<kj::Exception> local_2e8;
  undefined8 local_188;
  Exception EStack_180;
  
  local_328 = (_func_int **)addrs.size_;
  if (in_R8 != (_func_int **)0x0) {
    local_300 = &local_328;
    local_308 = &local_300;
    pOStack_310 = &local_338;
    local_338.disposer = (Disposer *)0x0;
    local_338.ptr = (PromiseNode *)0x0;
    local_318._vptr_Runnable = (_func_int **)&PTR_run_00469b80;
    pp_Stack_320 = in_R8;
    local_2f8 = addrs.ptr;
    local_2f0 = filter;
    _::runCatchingExceptions(&local_2e8,&local_318);
    local_188 = CONCAT71(local_188._1_7_,local_2e8.ptr.isSet);
    if ((kj)local_2e8.ptr.isSet == (kj)0x1) {
      EStack_180.ownFile.content.ptr = local_2e8.ptr.field_1.value.ownFile.content.ptr;
      EStack_180.ownFile.content.size_ = local_2e8.ptr.field_1.value.ownFile.content.size_;
      EStack_180.ownFile.content.disposer = local_2e8.ptr.field_1.value.ownFile.content.disposer;
      local_2e8.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      local_2e8.ptr.field_1.value.ownFile.content.size_ = 0;
      EStack_180.file = local_2e8.ptr.field_1.value.file;
      EStack_180.line = local_2e8.ptr.field_1.value.line;
      EStack_180.type = local_2e8.ptr.field_1.value.type;
      EStack_180.description.content.ptr = local_2e8.ptr.field_1.value.description.content.ptr;
      EStack_180.description.content.size_ = local_2e8.ptr.field_1.value.description.content.size_;
      EStack_180.description.content.disposer =
           local_2e8.ptr.field_1.value.description.content.disposer;
      EStack_180.context.ptr.disposer = local_2e8.ptr.field_1.value.context.ptr.disposer;
      local_2e8.ptr.field_1.value.description.content.ptr = (char *)0x0;
      local_2e8.ptr.field_1.value.description.content.size_ = 0;
      EStack_180.context.ptr.ptr = local_2e8.ptr.field_1.value.context.ptr.ptr;
      local_2e8.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
      memcpy(EStack_180.trace,(void *)((long)&local_2e8.ptr.field_1 + 0x50),0x104);
      Exception::~Exception(&local_2e8.ptr.field_1.value);
    }
    pDVar4 = local_338.disposer;
    pPVar5 = local_338.ptr;
    if (local_188._0_1_ == (kj)0x1) {
      OVar7 = heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_2e8,&EStack_180);
      pDVar4 = (Disposer *)local_2e8.ptr._0_8_;
      pPVar5 = (PromiseNode *)local_2e8.ptr.field_1.value.ownFile.content.ptr;
      if (local_338.ptr != (PromiseNode *)0x0) {
        ppp_Var1 = &(local_338.ptr)->_vptr_PromiseNode;
        ppp_Var2 = &(local_338.ptr)->_vptr_PromiseNode;
        local_338.ptr = (PromiseNode *)local_2e8.ptr.field_1.value.ownFile.content.ptr;
        (**(local_338.disposer)->_vptr_Disposer)
                  (local_338.disposer,(*ppp_Var1)[-2] + (long)ppp_Var2,OVar7.ptr);
        local_338.disposer = pDVar4;
        pDVar4 = local_338.disposer;
        pPVar5 = local_338.ptr;
      }
    }
    local_338.ptr = pPVar5;
    local_338.disposer = pDVar4;
    if (local_188._0_1_ == (kj)0x1) {
      Exception::~Exception(&EStack_180);
    }
    local_318._vptr_Runnable = local_328;
    pOStack_310 = (Own<kj::_::PromiseNode> *)pp_Stack_320;
    this = (TransformPromiseNodeBase *)operator_new(0x48);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,&local_338,
               _::
               TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncIoStream>_>,_kj::Own<kj::AsyncIoStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:1256:13),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:1259:8)>
               ::anon_class_1_0_00000001_for_func::operator());
    (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00469bb0;
    this[1].dependency.disposer = (Disposer *)filter;
    this[1].dependency.ptr = (PromiseNode *)addrs.ptr;
    this[1].continuationTracePtr = local_318._vptr_Runnable;
    this[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)pOStack_310;
    local_2e8.ptr._0_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncIoStream>>,kj::Own<kj::AsyncIoStream>,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>)::{lambda(kj::Own<kj::AsyncIoStream>&&)#1},kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>)::{lambda(kj::Exception&&)#1}>>
          ::instance;
    local_2e8.ptr.field_1.value.ownFile.content.ptr = (char *)this;
    OVar8 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                      ((kj *)&local_188,(Own<kj::_::PromiseNode> *)&local_2e8);
    uVar3 = local_2e8.ptr.field_1.value.ownFile.content.ptr;
    pCVar6 = OVar8.ptr;
    *(undefined4 *)&lowLevel->_vptr_LowLevelAsyncIoProvider = (undefined4)local_188;
    *(undefined4 *)((long)&lowLevel->_vptr_LowLevelAsyncIoProvider + 4) = local_188._4_4_;
    *(undefined4 *)&lowLevel[1]._vptr_LowLevelAsyncIoProvider = EStack_180.ownFile.content.ptr._0_4_
    ;
    *(undefined4 *)((long)&lowLevel[1]._vptr_LowLevelAsyncIoProvider + 4) =
         EStack_180.ownFile.content.ptr._4_4_;
    if ((TransformPromiseNodeBase *)local_2e8.ptr.field_1.value.ownFile.content.ptr !=
        (TransformPromiseNodeBase *)0x0) {
      local_2e8.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_2e8.ptr._0_8_)
                (local_2e8.ptr._0_8_,(char *)(uVar3 + *(long *)(*(long *)uVar3 + -0x10)));
      pCVar6 = extraout_RDX;
    }
    pPVar5 = local_338.ptr;
    if (local_338.ptr != (PromiseNode *)0x0) {
      local_338.ptr = (PromiseNode *)0x0;
      (**(local_338.disposer)->_vptr_Disposer)
                (local_338.disposer,pPVar5->_vptr_PromiseNode[-2] + (long)&pPVar5->_vptr_PromiseNode
                );
      pCVar6 = extraout_RDX_00;
    }
    PVar9.super_PromiseBase.node.ptr = &pCVar6->super_PromiseNode;
    PVar9.super_PromiseBase.node.disposer = (Disposer *)lowLevel;
    return (Promise<kj::Own<kj::AsyncIoStream>_>)PVar9.super_PromiseBase.node;
  }
  local_2e8.ptr._0_8_ = (Disposer *)0x0;
  local_188 = 0;
  EStack_180.ownFile.content.ptr = (char *)0x0;
  _::Debug::Fault::init
            ((Fault *)&local_2e8,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  _::Debug::Fault::fatal((Fault *)&local_2e8);
}

Assistant:

static Promise<Own<AsyncIoStream>> connectImpl(
      LowLevelAsyncIoProvider& lowLevel,
      LowLevelAsyncIoProvider::NetworkFilter& filter,
      ArrayPtr<SocketAddress> addrs) {
    KJ_ASSERT(addrs.size() > 0);

    return kj::evalNow([&]() -> Promise<Own<AsyncIoStream>> {
      if (!addrs[0].allowedBy(filter)) {
        return KJ_EXCEPTION(FAILED, "connect() blocked by restrictPeers()");
      } else {
        int fd = addrs[0].socket(SOCK_STREAM);
        return lowLevel.wrapConnectingSocketFd(
            fd, addrs[0].getRaw(), addrs[0].getRawSize(), NEW_FD_FLAGS);
      }
    }).then([](Own<AsyncIoStream>&& stream) -> Promise<Own<AsyncIoStream>> {
      // Success, pass along.
      return kj::mv(stream);
    }, [&lowLevel,&filter,addrs](Exception&& exception) mutable -> Promise<Own<AsyncIoStream>> {
      // Connect failed.
      if (addrs.size() > 1) {
        // Try the next address instead.
        return connectImpl(lowLevel, filter, addrs.slice(1, addrs.size()));
      } else {
        // No more addresses to try, so propagate the exception.
        return kj::mv(exception);
      }
    });
  }